

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# result_interface.h
# Opt level: O1

return_type * __thiscall
ezy::features::result_interface<ezy::features::result_adapter>::
impl<ezy::strong_type<std::variant<int,std::__cxx11::string>,void,ezy::features::result_like_continuation>>
::and_then<____C_A_T_C_H____T_E_S_T____28()::__27&>
          (return_type *__return_storage_ptr__,
          impl<ezy::strong_type<std::variant<int,std::__cxx11::string>,void,ezy::features::result_like_continuation>>
          *this,anon_class_1_0_00000001 *fn)

{
  pointer pcVar1;
  variant_alternative_t<1UL,_variant<int,_basic_string<char>_>_> *pvVar2;
  uint *puVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  anon_class_1_0_00000001 local_39;
  _Variadic_union<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  byte local_18;
  
  if (this[0x20] ==
      (impl<ezy::strong_type<std::variant<int,std::__cxx11::string>,void,ezy::features::result_like_continuation>>
       )0x0) {
    puVar3 = (uint *)std::get<0ul,int,std::__cxx11::string>
                               ((variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)this);
    local_18 = (*puVar3 & 1) != 0;
    if ((bool)local_18) {
      local_38._0_8_ = (long)&local_38 + 0x10;
      local_38._8_8_ = 4;
      local_38._16_5_ = 0x73706f6f;
    }
    else {
      local_38._M_first._M_storage = (_Uninitialized<int,_true>)((int)*puVar3 >> 1);
    }
    std::__detail::__variant::
    _Move_ctor_base<false,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_Move_ctor_base((_Move_ctor_base<false,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)__return_storage_ptr__,
                      (_Move_ctor_base<false,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_38._M_first);
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
      ::_S_vtable._M_arr[local_18]._M_data)
              (&local_39,
               (variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_38);
  }
  else {
    pvVar2 = std::get<1ul,int,std::__cxx11::string>
                       ((variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)this);
    local_38._0_8_ = (long)&local_38 + 0x10;
    pcVar1 = (pvVar2->_M_dataplus)._M_p;
    paVar4 = &pvVar2->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar1 == paVar4) {
      local_38._16_8_ = paVar4->_M_allocated_capacity;
      local_38._24_8_ = *(undefined8 *)((long)&pvVar2->field_2 + 8);
    }
    else {
      local_38._16_8_ = paVar4->_M_allocated_capacity;
      local_38._0_8_ = pcVar1;
    }
    local_38._8_8_ = pvVar2->_M_string_length;
    (pvVar2->_M_dataplus)._M_p = (pointer)paVar4;
    pvVar2->_M_string_length = 0;
    (pvVar2->field_2)._M_local_buf[0] = '\0';
    local_18 = 1;
    std::__detail::__variant::
    _Move_ctor_base<false,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_Move_ctor_base((_Move_ctor_base<false,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)__return_storage_ptr__,
                      (_Move_ctor_base<false,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_38._M_first);
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
      ::_S_vtable._M_arr[local_18]._M_data)
              (&local_39,
               (variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

constexpr decltype(auto) and_then(Fn&& fn) &&
      {
        return _impl::and_then(static_cast<T&&>(*this), std::forward<Fn>(fn));
      }